

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

int nextc(RN *rn)

{
  bool bVar1;
  int iVar2;
  RN *rn_local;
  
  bVar1 = rn->n < 200;
  if (bVar1) {
    iVar2 = rn->n;
    rn->n = iVar2 + 1;
    rn->buff[iVar2] = (char)rn->c;
    iVar2 = getc((FILE *)rn->f);
    rn->c = iVar2;
  }
  else {
    rn->buff[0] = '\0';
  }
  rn_local._4_4_ = (uint)bVar1;
  return rn_local._4_4_;
}

Assistant:

static int nextc (RN *rn) {
  if (rn->n >= L_MAXLENNUM) {  /* buffer overflow? */
    rn->buff[0] = '\0';  /* invalidate result */
    return 0;  /* fail */
  }
  else {
    rn->buff[rn->n++] = rn->c;  /* save current char */
    rn->c = l_getc(rn->f);  /* read next one */
    return 1;
  }
}